

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O0

line_data_t * kiste::parse_line(line_data_t *__return_storage_ptr__,parse_context *ctx)

{
  initializer_list<kiste::segment_t> __l;
  bool bVar1;
  char *pcVar2;
  segment_t *local_290;
  string local_258;
  allocator<char> local_231;
  string local_230;
  member_t local_210;
  allocator<char> local_1c9;
  string local_1c8;
  vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> local_1a8;
  allocator<char> local_181;
  string local_180;
  class_t local_160;
  allocator<char> local_119;
  string local_118;
  undefined4 local_f8;
  allocator<kiste::segment_t> local_f2;
  undefined1 local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  segment_t *local_b0;
  segment_t local_a8;
  undefined1 local_78 [56];
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rest;
  size_type pos_first_char;
  parse_context *ctx_local;
  
  rest.field_2._8_8_ = std::__cxx11::string::find_first_not_of((char *)&ctx->_line,0x1120da);
  if (rest.field_2._8_8_ == -1) {
    if ((ctx->_class_curly_level == 0) || (ctx->_curly_level <= ctx->_class_curly_level)) {
      memset(__return_storage_ptr__,0,0xa0);
      line_data_t::line_data_t(__return_storage_ptr__);
    }
    else {
      parse_text_line(__return_storage_ptr__,ctx,&ctx->_line);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)&ctx->_line);
    pcVar2 = (char *)std::__cxx11::string::at((ulong)&ctx->_line);
    if (*pcVar2 == '$') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"class",&local_119);
      bVar1 = starts_with((string *)local_40,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      if (bVar1) {
        parse_class(&local_160,ctx,(string *)local_40);
        line_data_t::line_data_t(__return_storage_ptr__,&local_160);
        class_t::~class_t(&local_160);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"endclass",&local_181);
        bVar1 = starts_with((string *)local_40,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator(&local_181);
        if (bVar1) {
          local_1a8.super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1a8.super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1a8.super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector(&local_1a8);
          line_data_t::line_data_t(__return_storage_ptr__,class_end,&local_1a8);
          std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector(&local_1a8);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c8,"member",&local_1c9);
          bVar1 = starts_with((string *)local_40,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::allocator<char>::~allocator(&local_1c9);
          if (bVar1) {
            parse_class_member(&local_210,ctx,(string *)local_40);
            line_data_t::line_data_t(__return_storage_ptr__,&local_210);
            member_t::~member_t(&local_210);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"|",&local_231);
            bVar1 = starts_with((string *)local_40,&local_230);
            std::__cxx11::string::~string((string *)&local_230);
            std::allocator<char>::~allocator(&local_231);
            if (bVar1) {
              std::__cxx11::string::substr((ulong)&local_258,(ulong)&ctx->_line);
              parse_text_line(__return_storage_ptr__,ctx,&local_258);
              std::__cxx11::string::~string((string *)&local_258);
            }
            else {
              parse_text_line(__return_storage_ptr__,ctx,&ctx->_line);
            }
          }
        }
      }
    }
    else if (*pcVar2 == '%') {
      local_f1 = 1;
      local_b0 = &local_a8;
      local_a8._end_pos = 0;
      local_a8._type = cpp;
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&ctx->_line);
      std::__cxx11::string::substr((ulong)&local_f0,(ulong)&ctx->_line);
      std::operator+(&local_a8._text,&local_d0,&local_f0);
      local_f1 = 0;
      local_78._0_8_ = &local_a8;
      local_78._8_8_ = 1;
      std::allocator<kiste::segment_t>::allocator(&local_f2);
      __l._M_len = local_78._8_8_;
      __l._M_array = (iterator)local_78._0_8_;
      std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
                ((vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)(local_78 + 0x10),
                 __l,&local_f2);
      line_data_t::line_data_t
                (__return_storage_ptr__,cpp,
                 (vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)(local_78 + 0x10));
      std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector
                ((vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)(local_78 + 0x10));
      std::allocator<kiste::segment_t>::~allocator(&local_f2);
      local_290 = (segment_t *)local_78;
      do {
        local_290 = local_290 + -1;
        segment_t::~segment_t(local_290);
      } while (local_290 != &local_a8);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else {
      parse_text_line(__return_storage_ptr__,ctx,&ctx->_line);
    }
    local_f8 = 1;
    std::__cxx11::string::~string((string *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse_line(const parse_context& ctx) -> line_data_t
  {
    const auto pos_first_char = ctx._line.find_first_not_of(" \t");
    if (pos_first_char == ctx._line.npos)
    {
      if (ctx._class_curly_level and ctx._curly_level > ctx._class_curly_level)
      {
        return parse_text_line(ctx, ctx._line);
      }
      else
      {
        return line_data_t{};
      }
    }
    else
    {
      const auto rest = ctx._line.substr(pos_first_char + 1);
      switch (ctx._line.at(pos_first_char))
      {
      case '%':  // cpp line
        return line_data_t{line_type::cpp,
                           std::vector<segment_t>{{0,
                                                   segment_type::cpp,
                                                   ctx._line.substr(0, pos_first_char) +
                                                       ctx._line.substr(pos_first_char + 1)}}};
        break;
      case '$':  // opening / closing class or text line
        if (starts_with(rest, "class"))
        {
          return {parse_class(ctx, rest)};
        }
        else if (starts_with(rest, "endclass"))
        {
          return {line_type::class_end, {}};
        }
        else if (starts_with(rest, "member"))
        {
          return parse_class_member(ctx, rest);
        }
        else if (starts_with(rest, "|"))  // trim left
        {
          return parse_text_line(ctx, ctx._line.substr(pos_first_char + 2));
        }
        else
        {
          return parse_text_line(ctx, ctx._line);
        }
        break;
      default:
        return parse_text_line(ctx, ctx._line);
      }
    }
  }